

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O1

void __thiscall
QOpenGLShaderProgram::setAttributeBuffer
          (QOpenGLShaderProgram *this,char *name,GLenum type,int offset,int tupleSize,int stride)

{
  int iVar1;
  
  iVar1 = attributeLocation(this,name);
  if (iVar1 != -1) {
    (**(code **)(**(long **)(*(long *)&this->field_0x8 + 0xd0) + 0x468))
              (iVar1,tupleSize,type,1,stride,(long)offset);
    return;
  }
  return;
}

Assistant:

void QOpenGLShaderProgram::setAttributeBuffer
    (const char *name, GLenum type, int offset, int tupleSize, int stride)
{
    setAttributeBuffer(attributeLocation(name), type, offset, tupleSize, stride);
}